

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void fmt::v6::internal::fallback_format<double>(double d,buffer<char> *buf,int *exp10)

{
  char *pcVar1;
  size_t sVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bigint *lhs2;
  unsigned_long value;
  uint uVar9;
  int exp;
  long lVar10;
  int iVar11;
  bool bVar12;
  bigint numerator;
  bigint lower;
  bigint upper_store;
  bigint denominator;
  bigint *local_2f8;
  ulong local_2f0;
  bigint local_2d0;
  bigint local_228;
  bigint local_180;
  bigint local_d8;
  
  local_2d0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_2d0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00164ed0;
  local_2d0.bigits_.super_buffer<unsigned_int>.ptr_ = local_2d0.bigits_.store_;
  local_2d0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_2d0.exp_ = 0;
  local_d8.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_d8.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00164ed0;
  local_d8.bigits_.super_buffer<unsigned_int>.ptr_ = local_d8.bigits_.store_;
  local_d8.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_d8.exp_ = 0;
  local_228.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_228.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00164ed0;
  local_228.bigits_.super_buffer<unsigned_int>.ptr_ = local_228.bigits_.store_;
  local_228.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_228.exp_ = 0;
  local_2f8 = &local_180;
  local_180.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_180.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00164ed0;
  local_180.bigits_.super_buffer<unsigned_int>.ptr_ = local_180.bigits_.store_;
  local_180.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_180.exp_ = 0;
  uVar8 = (ulong)d & 0xfffffffffffff;
  uVar9 = (uint)((ulong)d >> 0x34) & 0x7ff;
  if (uVar9 == 0) {
    value = uVar8 * 2;
    iVar5 = -0x432;
    iVar11 = 1;
    bVar12 = false;
    local_2f0 = uVar8;
LAB_001447d7:
    exp = *exp10;
    if (exp < 0) {
      bigint::assign_pow10(&local_2d0,-exp);
      sVar2 = local_2d0.bigits_.super_buffer<unsigned_int>.size_;
      if (local_228.bigits_.super_buffer<unsigned_int>.capacity_ <
          local_2d0.bigits_.super_buffer<unsigned_int>.size_) {
        (**local_228.bigits_.super_buffer<unsigned_int>._vptr_buffer)
                  (&local_228,local_2d0.bigits_.super_buffer<unsigned_int>.size_);
      }
      local_228.bigits_.super_buffer<unsigned_int>.size_ = sVar2;
      if (local_2d0.bigits_.super_buffer<unsigned_int>.size_ != 0) {
        memmove(local_228.bigits_.super_buffer<unsigned_int>.ptr_,
                local_2d0.bigits_.super_buffer<unsigned_int>.ptr_,
                local_2d0.bigits_.super_buffer<unsigned_int>.size_ << 2);
      }
      sVar2 = local_2d0.bigits_.super_buffer<unsigned_int>.size_;
      local_228.exp_ = local_2d0.exp_;
      if (bVar12) {
        if (local_180.bigits_.super_buffer<unsigned_int>.capacity_ <
            local_2d0.bigits_.super_buffer<unsigned_int>.size_) {
          (**local_180.bigits_.super_buffer<unsigned_int>._vptr_buffer)
                    (&local_180,local_2d0.bigits_.super_buffer<unsigned_int>.size_);
        }
        local_180.bigits_.super_buffer<unsigned_int>.size_ = sVar2;
        if (local_2d0.bigits_.super_buffer<unsigned_int>.size_ != 0) {
          memmove(local_180.bigits_.super_buffer<unsigned_int>.ptr_,
                  local_2d0.bigits_.super_buffer<unsigned_int>.ptr_,
                  local_2d0.bigits_.super_buffer<unsigned_int>.size_ << 2);
        }
        local_2f8 = &local_180;
        local_180.exp_ = local_2d0.exp_;
        bigint::operator<<=(local_2f8,1);
      }
      else {
        local_2f8 = (bigint *)0x0;
      }
      bigint::operator*=(&local_2d0,value);
      *local_d8.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
      if (local_d8.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
        (**local_d8.bigits_.super_buffer<unsigned_int>._vptr_buffer)(&local_d8,1);
      }
      local_d8.bigits_.super_buffer<unsigned_int>.size_ = 1;
      local_d8.exp_ = 0;
      bigint::operator<<=(&local_d8,iVar11 - iVar5);
    }
    else {
      uVar8 = 0xffffffffffffffff;
      do {
        uVar7 = uVar8;
        local_2d0.bigits_.store_[uVar7 + 1] = (uint)value;
        value = value >> 0x20;
        uVar8 = uVar7 + 1;
      } while (value != 0);
      if (0x1f < uVar7 + 1) {
        basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::grow
                  (&local_2d0.bigits_,uVar7 + 2);
        exp = *exp10;
      }
      local_2d0.exp_ = 0;
      local_2d0.bigits_.super_buffer<unsigned_int>.size_ = uVar7 + 2;
      bigint::assign_pow10(&local_d8,exp);
      bigint::operator<<=(&local_d8,iVar11 - iVar5);
      *local_228.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
      if (local_228.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
        (**local_228.bigits_.super_buffer<unsigned_int>._vptr_buffer)(&local_228,1);
      }
      local_228.bigits_.super_buffer<unsigned_int>.size_ = 1;
      local_228.exp_ = 0;
      if (bVar12) {
        *local_180.bigits_.super_buffer<unsigned_int>.ptr_ = 2;
        if (local_180.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
          (**local_180.bigits_.super_buffer<unsigned_int>._vptr_buffer)(&local_180,1);
        }
        local_2f8 = &local_180;
        local_180.bigits_.super_buffer<unsigned_int>.size_ = 1;
        local_180.exp_ = 0;
      }
      else {
        local_2f8 = (bigint *)0x0;
      }
    }
  }
  else {
    local_2f0 = uVar8 + 0x10000000000000;
    iVar5 = uVar9 - 0x433;
    bVar12 = uVar9 != 1 && uVar8 == 0;
    iVar11 = bVar12 + 1;
    value = local_2f0 << (sbyte)iVar11;
    if (uVar9 < 0x433) goto LAB_001447d7;
    uVar7 = 0xffffffffffffffff;
    do {
      uVar6 = uVar7;
      local_2d0.bigits_.store_[uVar6 + 1] = (uint)value;
      value = value >> 0x20;
      uVar7 = uVar6 + 1;
    } while (value != 0);
    if (0x1f < uVar6 + 1) {
      basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::grow
                (&local_2d0.bigits_,uVar6 + 2);
    }
    local_2d0.exp_ = 0;
    local_2d0.bigits_.super_buffer<unsigned_int>.size_ = uVar6 + 2;
    bigint::operator<<=(&local_2d0,iVar5);
    *local_228.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
    if (local_228.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
      (**local_228.bigits_.super_buffer<unsigned_int>._vptr_buffer)(&local_228,1);
    }
    local_228.bigits_.super_buffer<unsigned_int>.size_ = 1;
    local_228.exp_ = 0;
    bigint::operator<<=(&local_228,iVar5);
    if (uVar9 != 1 && uVar8 == 0) {
      *local_180.bigits_.super_buffer<unsigned_int>.ptr_ = 1;
      if (local_180.bigits_.super_buffer<unsigned_int>.capacity_ == 0) {
        (**local_180.bigits_.super_buffer<unsigned_int>._vptr_buffer)(&local_180,1);
      }
      local_180.bigits_.super_buffer<unsigned_int>.size_ = 1;
      local_180.exp_ = 0;
      bigint::operator<<=(&local_180,uVar9 - 0x432);
    }
    else {
      local_2f8 = (bigint *)0x0;
    }
    bigint::assign_pow10(&local_d8,*exp10);
    bigint::operator<<=(&local_d8,1);
  }
  lhs2 = local_2f8;
  if (local_2f8 == (bigint *)0x0) {
    lhs2 = &local_228;
  }
  pcVar1 = buf->ptr_;
  uVar9 = ~(uint)local_2f0 & 1;
  lVar10 = 0;
  while( true ) {
    uVar4 = bigint::divmod_assign(&local_2d0,&local_d8);
    iVar5 = compare(&local_2d0,&local_228);
    iVar11 = add_compare(&local_2d0,lhs2,&local_d8);
    pcVar1[lVar10] = (char)uVar4 + '0';
    if ((iVar5 < (int)uVar9) || ((int)-uVar9 < iVar11)) break;
    bigint::multiply(&local_2d0,10);
    bigint::multiply(&local_228,10);
    if (local_2f8 != (bigint *)0x0) {
      bigint::multiply(local_2f8,10);
    }
    lVar10 = lVar10 + 1;
  }
  if (iVar5 < (int)uVar9) {
    if (iVar11 <= (int)-uVar9) goto LAB_00144b87;
    iVar5 = add_compare(&local_2d0,&local_2d0,&local_d8);
    if ((iVar5 < 1) && ((uVar4 & 1) == 0 || iVar5 != 0)) goto LAB_00144b87;
    cVar3 = pcVar1[lVar10] + '\x01';
  }
  else {
    cVar3 = (char)uVar4 + '1';
  }
  pcVar1[lVar10] = cVar3;
LAB_00144b87:
  uVar8 = lVar10 + 1U & 0xffffffff;
  if (buf->capacity_ < uVar8) {
    (**buf->_vptr_buffer)(buf,uVar8);
  }
  buf->size_ = uVar8;
  *exp10 = *exp10 - (int)lVar10;
  bigint::~bigint(&local_180);
  bigint::~bigint(&local_228);
  bigint::~bigint(&local_d8);
  bigint::~bigint(&local_2d0);
  return;
}

Assistant:

void fallback_format(Double d, buffer<char>& buf, int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  fp value;
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  // TODO: handle float
  int shift = value.assign(d) ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= 1;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  if (!upper) upper = &lower;
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  bool even = (value.f & 1) == 0;
  int num_digits = 0;
  char* data = buf.data();
  for (;;) {
    int digit = numerator.divmod_assign(denominator);
    bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
    // numerator + upper >[=] pow10:
    bool high = add_compare(numerator, *upper, denominator) + even > 0;
    data[num_digits++] = static_cast<char>('0' + digit);
    if (low || high) {
      if (!low) {
        ++data[num_digits - 1];
      } else if (high) {
        int result = add_compare(numerator, numerator, denominator);
        // Round half to even.
        if (result > 0 || (result == 0 && (digit % 2) != 0))
          ++data[num_digits - 1];
      }
      buf.resize(to_unsigned(num_digits));
      exp10 -= num_digits - 1;
      return;
    }
    numerator *= 10;
    lower *= 10;
    if (upper != &lower) *upper *= 10;
  }
}